

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cc
# Opt level: O0

int google::protobuf::compiler::PluginMain(int argc,char **argv,CodeGenerator *generator)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  FileDescriptorProto *proto;
  string *psVar6;
  reference ppFVar7;
  size_type sVar8;
  ulong uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  byte local_169;
  undefined1 local_168 [7];
  bool succeeded;
  string error;
  FileDescriptor *file_1;
  undefined1 local_138 [4];
  int i_2;
  GeneratorResponseContext context;
  CodeGeneratorResponse response;
  int local_dc;
  undefined1 local_d8 [4];
  int i_1;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  parsed_files;
  FileDescriptor *file;
  undefined1 local_b0 [4];
  int i;
  DescriptorPool pool;
  undefined1 local_70 [8];
  CodeGeneratorRequest request;
  CodeGenerator *generator_local;
  char **argv_local;
  int argc_local;
  
  request._72_8_ = generator;
  if (argc < 2) {
    CodeGeneratorRequest::CodeGeneratorRequest((CodeGeneratorRequest *)local_70);
    bVar3 = Message::ParseFromFileDescriptor((Message *)local_70,0);
    if (bVar3) {
      DescriptorPool::DescriptorPool((DescriptorPool *)local_b0);
      for (file._4_4_ = 0;
          iVar4 = CodeGeneratorRequest::proto_file_size((CodeGeneratorRequest *)local_70),
          file._4_4_ < iVar4; file._4_4_ = file._4_4_ + 1) {
        proto = CodeGeneratorRequest::proto_file((CodeGeneratorRequest *)local_70,file._4_4_);
        parsed_files.
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)DescriptorPool::BuildFile((DescriptorPool *)local_b0,proto);
        if ((FileDescriptor *)
            parsed_files.
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == (FileDescriptor *)0x0) {
          argv_local._4_4_ = 1;
          pool.enforce_dependencies_ = true;
          pool.allow_unknown_ = false;
          pool._42_2_ = 0;
          goto LAB_00243ac3;
        }
      }
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *)local_d8);
      for (local_dc = 0;
          iVar4 = CodeGeneratorRequest::file_to_generate_size((CodeGeneratorRequest *)local_70),
          local_dc < iVar4; local_dc = local_dc + 1) {
        psVar6 = CodeGeneratorRequest::file_to_generate_abi_cxx11_
                           ((CodeGeneratorRequest *)local_70,local_dc);
        response._48_8_ = DescriptorPool::FindFileByName((DescriptorPool *)local_b0,psVar6);
        std::
        vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *)local_d8,(value_type *)&response._cached_size_);
        ppFVar7 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          *)local_d8);
        if (*ppFVar7 == (value_type)0x0) {
          poVar5 = std::operator<<((ostream *)&std::cerr,*argv);
          poVar5 = std::operator<<(poVar5,
                                   ": protoc asked plugin to generate a file but did not provide a descriptor for the file: "
                                  );
          psVar6 = CodeGeneratorRequest::file_to_generate_abi_cxx11_
                             ((CodeGeneratorRequest *)local_70,local_dc);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
          pool.enforce_dependencies_ = true;
          pool.allow_unknown_ = false;
          pool._42_2_ = 0;
          goto LAB_00243aa7;
        }
      }
      CodeGeneratorResponse::CodeGeneratorResponse((CodeGeneratorResponse *)&context.parsed_files_);
      GeneratorResponseContext::GeneratorResponseContext
                ((GeneratorResponseContext *)local_138,
                 (CodeGeneratorResponse *)&context.parsed_files_,
                 (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  *)local_d8);
      for (file_1._4_4_ = 0;
          sVar8 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::size((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          *)local_d8), (ulong)(long)file_1._4_4_ < sVar8;
          file_1._4_4_ = file_1._4_4_ + 1) {
        ppFVar7 = std::
                  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                *)local_d8,(long)file_1._4_4_);
        error.field_2._8_8_ = *ppFVar7;
        std::__cxx11::string::string((string *)local_168);
        uVar2 = request._72_8_;
        uVar1 = error.field_2._8_8_;
        psVar6 = CodeGeneratorRequest::parameter_abi_cxx11_((CodeGeneratorRequest *)local_70);
        local_169 = (**(code **)(*(long *)uVar2 + 0x10))(uVar2,uVar1,psVar6,local_138,local_168);
        local_169 = local_169 & 1;
        if ((local_169 == 0) && (uVar9 = std::__cxx11::string::empty(), (uVar9 & 1) != 0)) {
          std::__cxx11::string::operator=
                    ((string *)local_168,
                     "Code generator returned false but provided no error description.");
        }
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          psVar6 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)error.field_2._8_8_);
          std::operator+(&local_1b0,psVar6,": ");
          std::operator+(&local_190,&local_1b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_168);
          CodeGeneratorResponse::set_error
                    ((CodeGeneratorResponse *)&context.parsed_files_,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&local_1b0);
          pool.enforce_dependencies_ = true;
          pool.allow_unknown_ = false;
          pool._42_2_ = 0;
        }
        else {
          pool.enforce_dependencies_ = false;
          pool.allow_unknown_ = false;
          pool._42_2_ = 0;
        }
        std::__cxx11::string::~string((string *)local_168);
        if (pool._40_4_ != 0) break;
      }
      bVar3 = Message::SerializeToFileDescriptor((Message *)&context.parsed_files_,1);
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,*argv);
        poVar5 = std::operator<<(poVar5,": Error writing to stdout.");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      argv_local._4_4_ = (uint)!bVar3;
      pool.enforce_dependencies_ = true;
      pool.allow_unknown_ = false;
      pool._42_2_ = 0;
      GeneratorResponseContext::~GeneratorResponseContext((GeneratorResponseContext *)local_138);
      CodeGeneratorResponse::~CodeGeneratorResponse((CodeGeneratorResponse *)&context.parsed_files_)
      ;
LAB_00243aa7:
      std::
      vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)local_d8);
LAB_00243ac3:
      DescriptorPool::~DescriptorPool((DescriptorPool *)local_b0);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cerr,*argv);
      poVar5 = std::operator<<(poVar5,": protoc sent unparseable request to plugin.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      pool.enforce_dependencies_ = true;
      pool.allow_unknown_ = false;
      pool._42_2_ = 0;
    }
    CodeGeneratorRequest::~CodeGeneratorRequest((CodeGeneratorRequest *)local_70);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,*argv);
    poVar5 = std::operator<<(poVar5,": Unknown option: ");
    poVar5 = std::operator<<(poVar5,argv[1]);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int PluginMain(int argc, char* argv[], const CodeGenerator* generator) {

  if (argc > 1) {
    cerr << argv[0] << ": Unknown option: " << argv[1] << endl;
    return 1;
  }

#ifdef _WIN32
  _setmode(STDIN_FILENO, _O_BINARY);
  _setmode(STDOUT_FILENO, _O_BINARY);
#endif

  CodeGeneratorRequest request;
  if (!request.ParseFromFileDescriptor(STDIN_FILENO)) {
    cerr << argv[0] << ": protoc sent unparseable request to plugin." << endl;
    return 1;
  }

  DescriptorPool pool;
  for (int i = 0; i < request.proto_file_size(); i++) {
    const FileDescriptor* file = pool.BuildFile(request.proto_file(i));
    if (file == NULL) {
      // BuildFile() already wrote an error message.
      return 1;
    }
  }

  vector<const FileDescriptor*> parsed_files;
  for (int i = 0; i < request.file_to_generate_size(); i++) {
    parsed_files.push_back(pool.FindFileByName(request.file_to_generate(i)));
    if (parsed_files.back() == NULL) {
      cerr << argv[0] << ": protoc asked plugin to generate a file but "
              "did not provide a descriptor for the file: "
           << request.file_to_generate(i) << endl;
      return 1;
    }
  }

  CodeGeneratorResponse response;
  GeneratorResponseContext context(&response, parsed_files);

  for (int i = 0; i < parsed_files.size(); i++) {
    const FileDescriptor* file = parsed_files[i];

    string error;
    bool succeeded = generator->Generate(
        file, request.parameter(), &context, &error);

    if (!succeeded && error.empty()) {
      error = "Code generator returned false but provided no error "
              "description.";
    }
    if (!error.empty()) {
      response.set_error(file->name() + ": " + error);
      break;
    }
  }

  if (!response.SerializeToFileDescriptor(STDOUT_FILENO)) {
    cerr << argv[0] << ": Error writing to stdout." << endl;
    return 1;
  }

  return 0;
}